

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::web_peer_connection::incoming_payload(web_peer_connection *this,char *buf,int len)

{
  _Elt_pointer ppVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  peer_connection::received_bytes((peer_connection *)this,len,0);
  this->m_received_body = this->m_received_body + len;
  iVar3 = (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
            _vptr_bandwidth_socket[1])(this);
  if (((char)iVar3 == '\0') &&
     (peer_connection::peer_log
                ((peer_connection *)this,incoming_message,"INCOMING_PAYLOAD","%d bytes",
                 (ulong)(uint)len), 0 < len)) {
    do {
      ppVar1 = (this->super_web_connection_base).m_requests.
               super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->super_web_connection_base).m_requests.
          super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar1) {
        return;
      }
      iVar4 = (int)(this->m_piece).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
              (int)(this->m_piece).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_start;
      iVar3 = ppVar1->length - iVar4;
      if (len < iVar3) {
        iVar3 = len;
      }
      ::std::vector<char,_std::allocator<char>_>::resize
                (&(this->m_piece).super_vector<char,_std::allocator<char>_>,(long)(iVar3 + iVar4));
      memcpy((this->m_piece).super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start + iVar4,buf,(long)iVar3);
      buf = buf + iVar3;
      peer_connection::incoming_piece_fragment((peer_connection *)this,iVar3);
      maybe_harvest_piece(this);
      iVar4 = len - iVar3;
      bVar2 = iVar3 <= len;
      len = iVar4;
    } while (iVar4 != 0 && bVar2);
  }
  return;
}

Assistant:

void web_peer_connection::incoming_payload(char const* buf, int len)
{
	received_bytes(len, 0);
	m_received_body += len;

	if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::incoming_message, "INCOMING_PAYLOAD", "%d bytes", len);
#endif

	// deliver all complete bittorrent requests to the bittorrent engine
	while (len > 0)
	{
		if (m_requests.empty())
		{
			TORRENT_ASSERT(m_piece.empty());
			return;
		}

		TORRENT_ASSERT(!m_requests.empty());
		peer_request const& front_request = m_requests.front();
		int const piece_size = int(m_piece.size());
		int const copy_size = std::min(front_request.length - piece_size, len);

		// m_piece may not hold more than the response to the next BT request
		TORRENT_ASSERT(front_request.length > piece_size);
		TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);

		// copy_size is the number of bytes we need to add to the end of m_piece
		// to not exceed the size of the next bittorrent request to be delivered.
		// m_piece can only hold the response for a single BT request at a time
		m_piece.resize(piece_size + copy_size);
		std::memcpy(m_piece.data() + piece_size, buf, aux::numeric_cast<std::size_t>(copy_size));
		len -= copy_size;
		buf += copy_size;

		// keep peer stats up-to-date
		incoming_piece_fragment(copy_size);

		TORRENT_ASSERT(front_request.length >= piece_size);
		maybe_harvest_piece();
	}
}